

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRex.c
# Opt level: O0

char * Gia_ManRexPreprocess(char *pStr)

{
  size_t sVar1;
  char *pcVar2;
  int local_20;
  int local_1c;
  int k;
  int i;
  char *pCopy;
  char *pStr_local;
  
  sVar1 = strlen(pStr);
  pcVar2 = (char *)calloc(sVar1 * 2 + 10,1);
  *pcVar2 = '(';
  local_20 = 2;
  pcVar2[1] = '(';
  for (local_1c = 0; pStr[local_1c] != '\0'; local_1c = local_1c + 1) {
    if (pStr[local_1c] == '(') {
      pcVar2[local_20] = '(';
      local_20 = local_20 + 1;
    }
    else if (pStr[local_1c] == ')') {
      pcVar2[local_20] = ')';
      local_20 = local_20 + 1;
    }
    if ((((pStr[local_1c] != ' ') && (pStr[local_1c] != '\t')) && (pStr[local_1c] != '\n')) &&
       (pStr[local_1c] != '\r')) {
      pcVar2[local_20] = pStr[local_1c];
      local_20 = local_20 + 1;
    }
  }
  pcVar2[local_20] = ')';
  pcVar2[local_20 + 1] = ')';
  pcVar2[local_20 + 2] = '\0';
  return pcVar2;
}

Assistant:

char * Gia_ManRexPreprocess( char * pStr )
{
    char * pCopy = ABC_CALLOC( char, strlen(pStr) * 2 + 10 );
    int i, k = 0;
    pCopy[k++] = '(';
    pCopy[k++] = '(';
    for ( i = 0; pStr[i]; i++ )
    {
        if ( pStr[i] == '(' )
            pCopy[k++] = '(';
        else if ( pStr[i] == ')' )
            pCopy[k++] = ')';
        if ( pStr[i] != ' ' && pStr[i] != '\t' && pStr[i] != '\n' && pStr[i] != '\r' )
            pCopy[k++] = pStr[i];
    }
    pCopy[k++] = ')';
    pCopy[k++] = ')';
    pCopy[k++] = '\0';
    return pCopy;
}